

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O3

VectorXd __thiscall
Tools::CalculateRMSE
          (Tools *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *estimations,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *ground_truth)

{
  double *pdVar1;
  _func_int *p_Var2;
  pointer pMVar3;
  _func_int **pp_Var4;
  double dVar5;
  Index size;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar6;
  _func_int **pp_Var7;
  invalid_argument *this_00;
  long *in_RCX;
  ulong uVar8;
  long lVar9;
  DenseIndex extraout_RDX;
  DenseIndex extraout_RDX_00;
  DenseIndex DVar10;
  ulong uVar11;
  pointer pMVar12;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pEVar13;
  VectorXd VVar14;
  VectorXd current_estimate;
  VectorXd cur_ground_truth;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  tmp;
  VectorXd residual;
  scalar_sum_op<double> local_89;
  DenseStorage<double,__1,__1,_1,_0> local_88;
  DenseStorage<double,__1,__1,_1,_0> local_78;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  Matrix<double,__1,_1,_0,__1,_1> local_48;
  long *local_38;
  
  local_38 = in_RCX;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,4,4,1);
  local_68.m_row = 0;
  local_68.m_col = 1;
  local_68.m_currentBlockRows = 1;
  *this->_vptr_Tools = (_func_int *)0x0;
  local_88.m_data = (double *)0x0;
  local_68.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_68,(Scalar *)&local_88);
  local_78.m_data = (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&local_78);
  local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar6,(Scalar *)&local_48);
  if (((scalar_sum_op<double> *)(local_68.m_row + local_68.m_currentBlockRows) !=
       (scalar_sum_op<double> *)
       ((local_68.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
       m_rows) || (local_68.m_col != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/CommaInitializer.h"
                  ,0x6f,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pMVar12 = (ground_truth->
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (ground_truth->
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar3 == pMVar12) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Error: Estimation vector size should not be zero");
  }
  else {
    if ((long)pMVar3 - (long)pMVar12 == local_38[1] - *local_38) {
      uVar11 = 0;
      while( true ) {
        DVar10 = pMVar12[uVar11].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_88,DVar10,DVar10,1);
        pEVar13 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(pMVar12 + uVar11);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_88,pEVar13);
        if (local_88.m_rows != *(ulong *)(pEVar13 + 8)) break;
        uVar8 = local_88.m_rows - (local_88.m_rows >> 0x3f) & 0xfffffffffffffffe;
        if (1 < local_88.m_rows) {
          lVar9 = 0;
          do {
            pdVar1 = (double *)(*(long *)pEVar13 + lVar9 * 8);
            dVar5 = pdVar1[1];
            local_88.m_data[lVar9] = *pdVar1;
            (local_88.m_data + lVar9)[1] = dVar5;
            lVar9 = lVar9 + 2;
          } while (lVar9 < (long)uVar8);
        }
        if ((long)uVar8 < local_88.m_rows) {
          lVar9 = *(long *)pEVar13;
          do {
            local_88.m_data[uVar8] = *(double *)(lVar9 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (local_88.m_rows != uVar8);
        }
        lVar9 = *local_38;
        DVar10 = *(DenseIndex *)(lVar9 + 8 + uVar11 * 0x10);
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_78,DVar10,DVar10,1);
        pEVar13 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(lVar9 + uVar11 * 0x10);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_78,pEVar13);
        if (local_78.m_rows != *(ulong *)(pEVar13 + 8)) break;
        uVar8 = local_78.m_rows - (local_78.m_rows >> 0x3f) & 0xfffffffffffffffe;
        if (1 < local_78.m_rows) {
          lVar9 = 0;
          do {
            pdVar1 = (double *)(*(long *)pEVar13 + lVar9 * 8);
            dVar5 = pdVar1[1];
            local_78.m_data[lVar9] = *pdVar1;
            (local_78.m_data + lVar9)[1] = dVar5;
            lVar9 = lVar9 + 2;
          } while (lVar9 < (long)uVar8);
        }
        if ((long)uVar8 < local_78.m_rows) {
          lVar9 = *(long *)pEVar13;
          do {
            local_78.m_data[uVar8] = *(double *)(lVar9 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (local_78.m_rows != uVar8);
        }
        local_68.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)&local_88;
        local_68.m_row = (Index)&local_78;
        if (local_88.m_rows != local_78.m_rows) {
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/CwiseBinaryOp.h"
                        ,0x84,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((Matrix<double,_1,1,0,_1,1> *)&local_48,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_68);
        if (0 < local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
          lVar9 = 0;
          do {
            local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [lVar9] = local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data[lVar9] *
                      local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_rows != lVar9);
        }
        local_68.m_row = (Index)&local_89;
        local_68.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
        Eigen::
        SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
        ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&local_68,&local_48);
        free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        free(local_78.m_data);
        free(local_88.m_data);
        uVar11 = uVar11 + 1;
        pMVar12 = (ground_truth->
                  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)(ground_truth->
                      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >> 4;
        if (uVar8 <= uVar11) {
          local_68.m_col = (Index)(double)(long)uVar8;
          local_88.m_rows = (DenseIndex)&local_68;
          local_68.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this[1]._vptr_Tools;
          local_88.m_data = (double *)this;
          if ((long)local_68.m_xpr < 0) {
            __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/CwiseNullaryOp.h"
                          ,0x3f,
                          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                         );
          }
          Eigen::
          SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)&local_88,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)&local_68);
          DVar10 = extraout_RDX;
          if (0 < (long)this[1]._vptr_Tools) {
            pp_Var7 = this->_vptr_Tools;
            lVar9 = 0;
            do {
              p_Var2 = pp_Var7[lVar9];
              if ((double)p_Var2 < 0.0) {
                p_Var2 = (_func_int *)sqrt((double)p_Var2);
                DVar10 = extraout_RDX_00;
              }
              else {
                p_Var2 = (_func_int *)SQRT((double)p_Var2);
              }
              pp_Var4 = this[1]._vptr_Tools;
              if ((long)pp_Var4 <= lVar9) {
                __assert_fail("index >= 0 && index < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/DenseCoeffsBase.h"
                              ,0x17a,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                             );
              }
              pp_Var7 = this->_vptr_Tools;
              pp_Var7[lVar9] = p_Var2;
              lVar9 = lVar9 + 1;
            } while (lVar9 < (long)pp_Var4);
          }
          VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               DVar10;
          VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)this;
          return (VectorXd)
                 VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
        }
      }
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,
                    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Error: Estimation vector size should equal ground truth size");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

VectorXd Tools::CalculateRMSE(const vector<VectorXd> &estimations,
                              const vector<VectorXd> &ground_truth) {
    VectorXd rmse(4);
    rmse << 0,0,0,0;

    if(estimations.size() < 1) {
        throw std::invalid_argument( "Error: Estimation vector size should not be zero");
    }
    else if(estimations.size() != ground_truth.size()) {
        throw std::invalid_argument( "Error: Estimation vector size should equal ground truth size");
    } else {
        //accumulate squared residuals
        for(int i=0; i < estimations.size(); ++i){
            VectorXd current_estimate = estimations[i];
            VectorXd cur_ground_truth = ground_truth[i];
            VectorXd residual = current_estimate - cur_ground_truth;
            for(int j=0; j<residual.size(); ++j) {
                residual[j] = residual[j] * residual[j];
            }
            rmse += residual;
        }

        //calculate the mean
        rmse /= estimations.size();

        //calculate the squared root
        for(int i=0; i<rmse.size(); ++i) {
            rmse[i] = sqrt(rmse[i]);
        }

        //return the result
        return rmse;
    }
}